

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

string * __thiscall
pbrt::FloatMixTexture::ToString_abi_cxx11_(string *__return_storage_ptr__,FloatMixTexture *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&>
            (__return_storage_ptr__,"[ FloatMixTexture tex1: %s tex2: %s amount: %s ]",&this->tex1,
             &this->tex2,&this->amount);
  return __return_storage_ptr__;
}

Assistant:

std::string FloatMixTexture::ToString() const {
    return StringPrintf("[ FloatMixTexture tex1: %s tex2: %s amount: %s ]", tex1, tex2,
                        amount);
}